

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Parse(ParserImpl *this,Message *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Message *local_20;
  Message *output_local;
  ParserImpl *this_local;
  
  local_20 = output;
  output_local = (Message *)this;
  do {
    bVar1 = LookingAtType(this,TYPE_END);
    if (bVar1) {
      local_59 = 0;
      if (((this->had_errors_ & 1U) == 0) &&
         (this->recursion_limit_ != this->initial_recursion_limit_)) {
        internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x134);
        local_59 = 1;
        pLVar2 = internal::LogMessage::operator<<
                           (&local_58,
                            "CHECK failed: had_errors_ || recursion_limit_ == initial_recursion_limit_: "
                           );
        pLVar2 = internal::LogMessage::operator<<
                           (pLVar2,"Recursion limit at end of parse should be ");
        pLVar2 = internal::LogMessage::operator<<(pLVar2,this->initial_recursion_limit_);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,", but was ");
        pLVar2 = internal::LogMessage::operator<<(pLVar2,this->recursion_limit_);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,". Difference of ");
        pLVar2 = internal::LogMessage::operator<<
                           (pLVar2,this->initial_recursion_limit_ - this->recursion_limit_);
        pLVar2 = internal::LogMessage::operator<<
                           (pLVar2," stack frames not accounted for stack unwind.");
        internal::LogFinisher::operator=(local_6d,pLVar2);
      }
      if ((local_59 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_58);
      }
      return (bool)((this->had_errors_ ^ 0xffU) & 1);
    }
    bVar1 = ConsumeField(this,local_20);
  } while (bVar1);
  return false;
}

Assistant:

bool Parse(Message* output) {
    // Consume fields until we cannot do so anymore.
    while (true) {
      if (LookingAtType(io::Tokenizer::TYPE_END)) {
        // Ensures recursion limit properly unwinded, but only for success
        // cases. This implicitly avoids the check when `Parse` returns false
        // via `DO(...)`.
        GOOGLE_DCHECK(had_errors_ || recursion_limit_ == initial_recursion_limit_)
            << "Recursion limit at end of parse should be "
            << initial_recursion_limit_ << ", but was " << recursion_limit_
            << ". Difference of " << initial_recursion_limit_ - recursion_limit_
            << " stack frames not accounted for stack unwind.";

        return !had_errors_;
      }

      DO(ConsumeField(output));
    }
  }